

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charconvert_linux.c
# Opt level: O1

charconv * CharConvOpen(tchar_t *From,tchar_t *To)

{
  int iVar1;
  charconv *pcVar2;
  charconv *pcVar3;
  
  GetDefault();
  if ((From == (tchar_t *)0x0) || (*From == '\0')) {
    From = Current;
  }
  if ((To == (tchar_t *)0x0) || (*To == '\0')) {
    To = Current;
  }
  iVar1 = tcsicmp(To,From);
  if (iVar1 == 0) {
    pcVar3 = (charconv *)0x0;
  }
  else {
    pcVar2 = (charconv *)iconv_open(To,From);
    pcVar3 = (charconv *)0x0;
    if (pcVar2 != (charconv *)0xffffffffffffffff) {
      pcVar3 = pcVar2;
    }
  }
  return pcVar3;
}

Assistant:

charconv* CharConvOpen(const tchar_t* From, const tchar_t* To)
{
    iconv_t CC;

    GetDefault();

    if (!From || !From[0])
        From = Current;

    if (!To || !To[0])
        To = Current;

    if (tcsicmp(To,From)==0)
        return NULL;

    CC = iconv_open(To,From);
    if (CC == (iconv_t)-1)
        return NULL;

    return (charconv*)CC;
}